

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ect.cc
# Opt level: O0

size_t final_depth(size_t eliminations)

{
  ostream *this;
  long in_RDI;
  size_t i;
  ulong local_18;
  
  local_18 = 0;
  while( true ) {
    if (0x1f < local_18) {
      this = std::operator<<((ostream *)&std::cerr,"too many eliminations");
      std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
      return 0x1f;
    }
    if (in_RDI - 1U >> ((byte)local_18 & 0x3f) == 0) break;
    local_18 = local_18 + 1;
  }
  return local_18;
}

Assistant:

size_t final_depth(size_t eliminations)
{
  eliminations--;
  for (size_t i = 0; i < 32; i++)
    if (eliminations >> i == 0)
      return i;
  cerr << "too many eliminations" << endl;
  return 31;
}